

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O0

ostream * subsat::operator<<(ostream *os,ConstraintRef cr)

{
  bool bVar1;
  int __c;
  char *pcVar2;
  ostream *in_RDI;
  ostream *poVar3;
  ConstraintRef local_4;
  
  pcVar2 = "ConstraintRef{";
  std::operator<<(in_RDI,"ConstraintRef{");
  bVar1 = ConstraintRef::is_valid((ConstraintRef *)in_RDI);
  if (bVar1) {
    poVar3 = in_RDI;
    pcVar2 = ConstraintRef::index(&local_4,pcVar2,__c);
    std::ostream::operator<<(in_RDI,(uint)pcVar2);
  }
  else {
    std::operator<<(in_RDI,"-");
    poVar3 = in_RDI;
  }
  std::operator<<(poVar3,"}");
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ConstraintRef cr)
{
  os << "ConstraintRef{";
  if (cr.is_valid()) {
    os << cr.index();
  } else {
    os << "-";
  }
  os << "}";
  return os;
}